

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSSimpleTypeDefinition.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XSSimpleTypeDefinition::XSSimpleTypeDefinition
          (XSSimpleTypeDefinition *this,DatatypeValidator *datatypeValidator,VARIETY stVariety,
          XSTypeDefinition *xsBaseType,XSSimpleTypeDefinition *primitiveOrItemType,
          XSSimpleTypeDefinitionList *memberTypes,XSAnnotation *headAnnot,XSModel *xsModel,
          MemoryManager *manager)

{
  uint uVar1;
  RefVectorOf<xercesc_4_0::XSAnnotation> *this_00;
  XSAnnotation *local_58;
  XSAnnotation *annot;
  int finalset;
  XSSimpleTypeDefinitionList *memberTypes_local;
  XSSimpleTypeDefinition *primitiveOrItemType_local;
  XSTypeDefinition *xsBaseType_local;
  VARIETY stVariety_local;
  DatatypeValidator *datatypeValidator_local;
  XSSimpleTypeDefinition *this_local;
  
  XSTypeDefinition::XSTypeDefinition
            (&this->super_XSTypeDefinition,SIMPLE_TYPE,xsBaseType,xsModel,manager);
  (this->super_XSTypeDefinition).super_XSObject._vptr_XSObject =
       (_func_int **)&PTR__XSSimpleTypeDefinition_0052e880;
  this->fDefinedFacets = 0;
  this->fFixedFacets = 0;
  this->fVariety = stVariety;
  this->fDatatypeValidator = datatypeValidator;
  this->fXSFacetList = (XSFacetList *)0x0;
  this->fXSMultiValueFacetList = (XSMultiValueFacetList *)0x0;
  this->fPatternList = (StringList *)0x0;
  this->fPrimitiveOrItemType = primitiveOrItemType;
  this->fMemberTypes = memberTypes;
  this->fXSAnnotationList = (XSAnnotationList *)0x0;
  uVar1 = DatatypeValidator::getFinalSet(this->fDatatypeValidator);
  if (uVar1 != 0) {
    if ((uVar1 & 2) != 0) {
      (this->super_XSTypeDefinition).fFinal = (this->super_XSTypeDefinition).fFinal | 1;
    }
    if ((uVar1 & 4) != 0) {
      (this->super_XSTypeDefinition).fFinal = (this->super_XSTypeDefinition).fFinal | 2;
    }
    if ((uVar1 & 8) != 0) {
      (this->super_XSTypeDefinition).fFinal = (this->super_XSTypeDefinition).fFinal | 0x10;
    }
    if ((uVar1 & 0x10) != 0) {
      (this->super_XSTypeDefinition).fFinal = (this->super_XSTypeDefinition).fFinal | 8;
    }
  }
  if (headAnnot != (XSAnnotation *)0x0) {
    local_58 = headAnnot;
    this_00 = (RefVectorOf<xercesc_4_0::XSAnnotation> *)XMemory::operator_new(0x30,manager);
    RefVectorOf<xercesc_4_0::XSAnnotation>::RefVectorOf(this_00,3,false,manager);
    this->fXSAnnotationList = this_00;
    do {
      BaseRefVectorOf<xercesc_4_0::XSAnnotation>::addElement
                (&this->fXSAnnotationList->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>,local_58
                );
      local_58 = XSAnnotation::getNext(local_58);
    } while (local_58 != (XSAnnotation *)0x0);
  }
  return;
}

Assistant:

XSSimpleTypeDefinition::XSSimpleTypeDefinition
(
    DatatypeValidator* const            datatypeValidator
    , VARIETY                           stVariety
    , XSTypeDefinition* const           xsBaseType
    , XSSimpleTypeDefinition* const     primitiveOrItemType
    , XSSimpleTypeDefinitionList* const memberTypes
    , XSAnnotation*                     headAnnot
    , XSModel* const                    xsModel
    , MemoryManager* const              manager
)
    : XSTypeDefinition(SIMPLE_TYPE, xsBaseType, xsModel, manager)
    , fDefinedFacets(0)
    , fFixedFacets(0)
    , fVariety(stVariety)
    , fDatatypeValidator(datatypeValidator)
    , fXSFacetList(0)
    , fXSMultiValueFacetList(0)
    , fPatternList(0)
    , fPrimitiveOrItemType(primitiveOrItemType)
    , fMemberTypes(memberTypes)
    , fXSAnnotationList(0)
{
    int finalset = fDatatypeValidator->getFinalSet();
    if (finalset)
    {
        if (finalset & SchemaSymbols::XSD_EXTENSION)
            fFinal |= XSConstants::DERIVATION_EXTENSION;

        if (finalset & SchemaSymbols::XSD_RESTRICTION)
            fFinal |= XSConstants::DERIVATION_RESTRICTION;

        if (finalset & SchemaSymbols::XSD_LIST)
            fFinal |= XSConstants::DERIVATION_LIST;

        if (finalset & SchemaSymbols::XSD_UNION)
            fFinal |= XSConstants::DERIVATION_UNION;
    }

    if (headAnnot)
    {
        XSAnnotation* annot = headAnnot;

        fXSAnnotationList = new (manager) RefVectorOf<XSAnnotation>(3, false, manager);
        do
        {
            fXSAnnotationList->addElement(annot);
            annot = annot->getNext();
        } while (annot);
    }
}